

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int valueFromValueList(sqlite3_value *pVal,sqlite3_value **ppOut,int bNext)

{
  Mem *pMem;
  byte bVar1;
  int iVar2;
  undefined8 *puVar3;
  uint local_90;
  int iOff;
  sqlite3_value *pOut;
  MemValue MStack_78;
  u32 iSerial;
  u8 *zBuf;
  Mem sMem;
  u32 sz;
  int dummy;
  ValueList *pRhs;
  int rc;
  int bNext_local;
  sqlite3_value **ppOut_local;
  sqlite3_value *pVal_local;
  
  *ppOut = (sqlite3_value *)0x0;
  if (pVal == (sqlite3_value *)0x0) {
    pVal_local._4_4_ = 0x15;
  }
  else {
    puVar3 = (undefined8 *)sqlite3_value_pointer(pVal,"ValueList");
    if (puVar3 == (undefined8 *)0x0) {
      pVal_local._4_4_ = 0x15;
    }
    else {
      if (bNext == 0) {
        sMem.xDel._4_4_ = 0;
        pRhs._0_4_ = sqlite3BtreeFirst((BtCursor *)*puVar3,(int *)((long)&sMem.xDel + 4));
        iVar2 = sqlite3BtreeEof((BtCursor *)*puVar3);
        if (iVar2 != 0) {
          pRhs._0_4_ = 0x65;
        }
      }
      else {
        pRhs._0_4_ = sqlite3BtreeNext((BtCursor *)*puVar3,0);
      }
      if ((int)pRhs == 0) {
        memset(&zBuf,0,0x38);
        sMem.xDel._0_4_ = sqlite3BtreePayloadSize((BtCursor *)*puVar3);
        pRhs._0_4_ = sqlite3VdbeMemFromBtreeZeroOffset
                               ((BtCursor *)*puVar3,(u32)sMem.xDel,(Mem *)&zBuf);
        if ((int)pRhs == 0) {
          MStack_78 = sMem.u;
          pMem = (Mem *)puVar3[1];
          if (*(byte *)(sMem.u.i + 1) < 0x80) {
            pOut._4_4_ = (uint)*(byte *)(sMem.u.i + 1);
            local_90 = 1;
          }
          else {
            bVar1 = sqlite3GetVarint32((uchar *)(sMem.u.i + 1),(u32 *)((long)&pOut + 4));
            local_90 = (uint)bVar1;
          }
          sqlite3VdbeSerialGet((uchar *)(MStack_78.zPType + (int)(local_90 + 1)),pOut._4_4_,pMem);
          pMem->enc = pMem->db->enc;
          if (((pMem->flags & 0x4000) == 0) ||
             (iVar2 = sqlite3VdbeMemMakeWriteable(pMem), iVar2 == 0)) {
            *ppOut = pMem;
          }
          else {
            pRhs._0_4_ = 7;
          }
        }
        sqlite3VdbeMemRelease((Mem *)&zBuf);
      }
      pVal_local._4_4_ = (int)pRhs;
    }
  }
  return pVal_local._4_4_;
}

Assistant:

static int valueFromValueList(
  sqlite3_value *pVal,        /* Pointer to the ValueList object */
  sqlite3_value **ppOut,      /* Store the next value from the list here */
  int bNext                   /* 1 for _next(). 0 for _first() */
){
  int rc;
  ValueList *pRhs;

  *ppOut = 0;
  if( pVal==0 ) return SQLITE_MISUSE;
  pRhs = (ValueList*)sqlite3_value_pointer(pVal, "ValueList");
  if( pRhs==0 ) return SQLITE_MISUSE;
  if( bNext ){
    rc = sqlite3BtreeNext(pRhs->pCsr, 0);
  }else{
    int dummy = 0;
    rc = sqlite3BtreeFirst(pRhs->pCsr, &dummy);
    assert( rc==SQLITE_OK || sqlite3BtreeEof(pRhs->pCsr) );
    if( sqlite3BtreeEof(pRhs->pCsr) ) rc = SQLITE_DONE;
  }
  if( rc==SQLITE_OK ){
    u32 sz;       /* Size of current row in bytes */
    Mem sMem;     /* Raw content of current row */
    memset(&sMem, 0, sizeof(sMem));
    sz = sqlite3BtreePayloadSize(pRhs->pCsr);
    rc = sqlite3VdbeMemFromBtreeZeroOffset(pRhs->pCsr,(int)sz,&sMem);
    if( rc==SQLITE_OK ){
      u8 *zBuf = (u8*)sMem.z;
      u32 iSerial;
      sqlite3_value *pOut = pRhs->pOut;
      int iOff = 1 + getVarint32(&zBuf[1], iSerial);
      sqlite3VdbeSerialGet(&zBuf[iOff], iSerial, pOut);
      pOut->enc = ENC(pOut->db);
      if( (pOut->flags & MEM_Ephem)!=0 && sqlite3VdbeMemMakeWriteable(pOut) ){
        rc = SQLITE_NOMEM;
      }else{
        *ppOut = pOut;
      }
    }
    sqlite3VdbeMemRelease(&sMem);
  }
  return rc;
}